

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  bool bVar1;
  int *piVar2;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 uVar3;
  int local_13c;
  string local_138 [24];
  undefined8 in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  allocator<char> local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40;
  __pid_t local_20;
  int local_1c;
  int gtest_retval;
  int status_value;
  ForkingDeathTest *this_local;
  
  _gtest_retval = this;
  bVar1 = DeathTestImpl::spawned(&this->super_DeathTestImpl);
  if (bVar1) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    do {
      do {
        local_20 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x2c,&local_1c,0);
        uVar3 = false;
        if (local_20 == -1) {
          piVar2 = __errno_location();
          uVar3 = *piVar2 == 4;
        }
      } while ((bool)uVar3 != false);
      if (local_20 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_100,"CHECK failed: File ",&local_101);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)CONCAT17(uVar3,in_stack_fffffffffffffeb0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)CONCAT17(uVar3,in_stack_fffffffffffffeb0));
        local_13c = 0x407;
        StreamableToString<int>((string *)local_138,&local_13c);
        std::operator+(in_stack_fffffffffffffee8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffee0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)CONCAT17(uVar3,in_stack_fffffffffffffeb0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)CONCAT17(uVar3,in_stack_fffffffffffffeb0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)CONCAT17(uVar3,in_stack_fffffffffffffeb0));
        DeathTestAbort(&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string(local_60);
        std::__cxx11::string::~string(local_80);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::~string(local_138);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator(&local_101);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_status(&this->super_DeathTestImpl,local_1c);
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}